

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::isFormatSupportedForTextureBuffer(TextureFormat *format)

{
  byte bVar1;
  ulong uVar2;
  ChannelType CVar3;
  
  bVar1 = 0;
  switch(format->order) {
  case R:
  case RG:
  case RGBA:
    CVar3 = format->type;
    if (FLOAT < CVar3) {
LAB_0124a626:
      bVar1 = 0;
      goto switchD_0124a5f9_caseD_1;
    }
    uVar2 = 0xef8000008;
    break;
  default:
    goto switchD_0124a5f9_caseD_1;
  case RGB:
    CVar3 = format->type;
    if (FLOAT < CVar3) goto LAB_0124a626;
    uVar2 = 0xa20000000;
  }
  bVar1 = (byte)(uVar2 >> ((byte)CVar3 & 0x3f));
switchD_0124a5f9_caseD_1:
  return (bool)(bVar1 & 1);
}

Assistant:

static inline bool isFormatSupportedForTextureBuffer (const TextureFormat& format)
{
	switch (format.order)
	{
		case TextureFormat::RGB:
			return format.type == TextureFormat::FLOAT				||
				   format.type == TextureFormat::SIGNED_INT32		||
				   format.type == TextureFormat::UNSIGNED_INT32;

		// \note Fallthroughs.
		case TextureFormat::R:
		case TextureFormat::RG:
		case TextureFormat::RGBA:
			return format.type == TextureFormat::UNORM_INT8			||
				   format.type == TextureFormat::HALF_FLOAT			||
				   format.type == TextureFormat::FLOAT				||
				   format.type == TextureFormat::SIGNED_INT8		||
				   format.type == TextureFormat::SIGNED_INT16		||
				   format.type == TextureFormat::SIGNED_INT32		||
				   format.type == TextureFormat::UNSIGNED_INT8		||
				   format.type == TextureFormat::UNSIGNED_INT16		||
				   format.type == TextureFormat::UNSIGNED_INT32;

		default:
			return false;
	}
}